

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O1

int __thiscall
alex::AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_>::expand
          (AlexModelNode<double,_double,_std::allocator<std::pair<double,_double>_>_> *this,
          int log2_expansion_factor)

{
  byte bVar1;
  int iVar2;
  AlexNode<double,_double> *pAVar3;
  double dVar4;
  AlexNode<double,_double> **ppAVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  double dVar15;
  new_allocator<alex::AlexNode<double,_double>_*> local_29;
  
  if (-1 < log2_expansion_factor) {
    iVar10 = this->num_children_ << (log2_expansion_factor & 0x1fU);
    iVar9 = 0;
    ppAVar5 = __gnu_cxx::new_allocator<alex::AlexNode<double,_double>_*>::allocate
                        (&local_29,(long)iVar10,(void *)0x0);
    iVar2 = this->num_children_;
    if (0 < (long)iVar2) {
      auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        pAVar3 = this->children_[iVar9];
        bVar1 = pAVar3->duplication_factor_;
        iVar6 = iVar9 << (log2_expansion_factor & 0x1fU);
        iVar9 = (1 << (bVar1 & 0x1f)) + iVar9;
        iVar7 = iVar9 << (log2_expansion_factor & 0x1fU);
        if (iVar6 < iVar7) {
          auVar12 = vpbroadcastq_avx512f();
          auVar13 = vpbroadcastq_avx512f();
          uVar8 = 0;
          do {
            auVar14 = vpbroadcastq_avx512f();
            auVar14 = vporq_avx512f(auVar14,auVar11);
            vpcmpuq_avx512f(auVar14,auVar12,2);
            auVar14 = vmovdqu64_avx512f(auVar13);
            *(undefined1 (*) [64])(ppAVar5 + (long)iVar6 + uVar8) = auVar14;
            uVar8 = uVar8 + 8;
          } while ((((long)iVar7 - (long)iVar6) + 7U & 0xfffffffffffffff8) != uVar8);
        }
        pAVar3->duplication_factor_ = bVar1 + (char)log2_expansion_factor;
      } while (iVar9 < iVar2);
    }
    iVar9 = 1 << (log2_expansion_factor & 0x1fU);
    operator_delete(this->children_,(long)iVar2 << 3);
    this->children_ = ppAVar5;
    this->num_children_ = iVar10;
    dVar15 = (double)iVar9;
    dVar4 = (this->super_AlexNode<double,_double>).model_.b_;
    (this->super_AlexNode<double,_double>).model_.a_ =
         dVar15 * (this->super_AlexNode<double,_double>).model_.a_;
    (this->super_AlexNode<double,_double>).model_.b_ = dVar15 * dVar4;
    return iVar9;
  }
  __assert_fail("log2_expansion_factor >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex_nodes.h"
                ,0x77,
                "int alex::AlexModelNode<double, double>::expand(int) [T = double, P = double, Alloc = std::allocator<std::pair<double, double>>]"
               );
}

Assistant:

int expand(int log2_expansion_factor) {
    assert(log2_expansion_factor >= 0);
    int expansion_factor = 1 << log2_expansion_factor;
    int num_new_children = num_children_ * expansion_factor;
    auto new_children = new (pointer_allocator().allocate(num_new_children))
        AlexNode<T, P>*[num_new_children];
    int cur = 0;
    while (cur < num_children_) {
      AlexNode<T, P>* cur_child = children_[cur];
      int cur_child_repeats = 1 << cur_child->duplication_factor_;
      for (int i = expansion_factor * cur;
           i < expansion_factor * (cur + cur_child_repeats); i++) {
        new_children[i] = cur_child;
      }
      cur_child->duplication_factor_ += log2_expansion_factor;
      cur += cur_child_repeats;
    }
    pointer_allocator().deallocate(children_, num_children_);
    children_ = new_children;
    num_children_ = num_new_children;
    this->model_.expand(expansion_factor);
    return expansion_factor;
  }